

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osifcnet.cpp
# Opt level: O1

void __thiscall OS_HttpPayload::add_tstr(OS_HttpPayload *this,char *name,char *val)

{
  ushort uVar1;
  ushort uVar2;
  OS_HttpPayloadItem *pOVar3;
  char *pcVar4;
  OS_HttpPayload *pOVar5;
  
  pOVar3 = (OS_HttpPayloadItem *)operator_new(0x28);
  uVar1 = *(ushort *)name;
  uVar2 = *(ushort *)val;
  pOVar3->stream = (CVmDataSource *)0x0;
  pOVar3->mime_type = (char *)0x0;
  pOVar3->name = (char *)0x0;
  pOVar3->val = (char *)0x0;
  pOVar3->nxt = (OS_HttpPayloadItem *)0x0;
  pcVar4 = lib_copy_str(name + 2,(ulong)uVar1);
  pOVar3->name = pcVar4;
  pcVar4 = lib_copy_str(val + 2,(ulong)uVar2);
  pOVar3->val = pcVar4;
  pOVar5 = (OS_HttpPayload *)&this->last_item->nxt;
  if (this->last_item == (OS_HttpPayloadItem *)0x0) {
    pOVar5 = this;
  }
  pOVar5->first_item = pOVar3;
  this->last_item = pOVar3;
  return;
}

Assistant:

void OS_HttpPayload::add_tstr(const char *name, const char *val)
{
    add(new OS_HttpPayloadItem(name + VMB_LEN, vmb_get_len(name),
                               val + VMB_LEN, vmb_get_len(val)));
}